

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_stl(DisasContext_conflict1 *s,arg_STL *a,MemOp mop)

{
  int iVar1;
  uint64_t uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGTemp *ts;
  TCGTemp *pTVar3;
  uintptr_t o;
  TCGv_i32 var;
  
  uVar2 = s->features;
  if (((uint)uVar2 >> 0x1b & 1) != 0) {
    iVar1 = a->rn;
    if ((iVar1 == 0xf) || (a->rt == 0xf)) {
      unallocated_encoding_aarch64(s);
    }
    else {
      s_00 = s->uc->tcg_ctx;
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      load_reg_var(s,(TCGv_i32)((long)ts - (long)s_00),iVar1);
      iVar1 = a->rt;
      s_01 = s->uc->tcg_ctx;
      pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar3 - (long)s_01);
      load_reg_var(s,var,iVar1);
      tcg_gen_mb_aarch64(s_00,TCG_BAR_STRL|TCG_MO_ALL);
      gen_aa32_st_i32(s,var,(TCGv_i32)((long)ts - (long)s_00),s->mmu_idx & 0xf,s->be_data | mop);
      disas_set_da_iss(s,mop,a->rt | (ISSIsWrite|ISSIsAcqRel));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,ts);
    }
  }
  return (_Bool)((byte)(uVar2 >> 0x18) >> 3 & 1);
}

Assistant:

static bool op_stl(DisasContext *s, arg_STL *a, MemOp mop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_8) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = load_reg(s, a->rn);
    tmp = load_reg(s, a->rt);
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s), mop | s->be_data);
    disas_set_da_iss(s, mop, a->rt | ISSIsAcqRel | ISSIsWrite);

    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}